

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_new_session_ticket
              (uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *ticket,
              uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  uint32_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *end_00;
  uint8_t *puVar4;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t found [8];
  size_t local_60;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint16_t exttype;
  uint8_t *end_local;
  uint8_t *src_local;
  uint32_t *max_early_data_size_local;
  ptls_iovec_t *ticket_local;
  uint32_t *age_add_local;
  uint32_t *lifetime_local;
  
  _ret = end;
  end_local = src;
  src_local = (uint8_t *)max_early_data_size;
  max_early_data_size_local = (uint32_t *)ticket;
  ticket_local = (ptls_iovec_t *)age_add;
  age_add_local = lifetime;
  _capacity._0_4_ = decode32(lifetime,&end_local,end);
  if (((int)_capacity == 0) &&
     (_capacity._0_4_ = decode32((uint32_t *)ticket_local,&end_local,_ret),
     puVar1 = max_early_data_size_local, (int)_capacity == 0)) {
    _block_size = 2;
    if ((ulong)((long)_ret - (long)end_local) < 2) {
      _capacity._0_4_ = 0x32;
    }
    else {
      end_1 = (uint8_t *)0x0;
      do {
        puVar4 = end_local + 1;
        end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end_local);
        _block_size = _block_size - 1;
        end_local = puVar4;
      } while (_block_size != 0);
      if (_ret + -(long)puVar4 < end_1) {
        _capacity._0_4_ = 0x32;
      }
      else {
        puVar3 = puVar4 + (long)end_1;
        if (puVar4 == puVar3) {
          _capacity._0_4_ = 0x32;
        }
        else {
          _found = ptls_iovec_init(puVar4,(long)puVar3 - (long)puVar4);
          *(uint8_t (*) [8])puVar1 = found;
          *(size_t *)(puVar1 + 2) = local_60;
          src_local[0] = '\0';
          src_local[1] = '\0';
          src_local[2] = '\0';
          src_local[3] = '\0';
          end_local = puVar3;
          memset(&_capacity_1,0,8);
          _block_size_1 = 2;
          if ((ulong)((long)_ret - (long)end_local) < 2) {
            _capacity._0_4_ = 0x32;
          }
          else {
            end_2 = (uint8_t *)0x0;
            do {
              puVar4 = end_local + 1;
              end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end_local);
              _block_size_1 = _block_size_1 - 1;
              end_local = puVar4;
            } while (_block_size_1 != 0);
            if (_ret + -(long)puVar4 < end_2) {
              _capacity._0_4_ = 0x32;
            }
            else {
              puVar4 = puVar4 + (long)end_2;
              do {
                if (end_local == puVar4) {
                  if (end_local != puVar4) {
                    return 0x32;
                  }
                  if (end_local != _ret) {
                    return 0x32;
                  }
                  return 0;
                }
                _capacity._0_4_ = decode16((uint16_t *)((long)&_capacity + 6),&end_local,puVar4);
                if ((int)_capacity != 0) {
                  return (int)_capacity;
                }
                if (_capacity._6_2_ < 8) {
                  if (((uint)found[(long)(int)(_capacity._6_2_ / 8) + -8] &
                      1 << (sbyte)((ulong)_capacity._6_2_ % 8)) != 0) {
                    return 0x2f;
                  }
                  found[(long)(int)(_capacity._6_2_ / 8) + -8] =
                       found[(long)(int)(_capacity._6_2_ / 8) + -8] |
                       (byte)(1 << ((byte)_capacity._6_2_ & 0x1f)) & 7;
                }
                _block_size_2 = 2;
                if ((ulong)((long)puVar4 - (long)end_local) < 2) {
                  return 0x32;
                }
                end_3 = (uint8_t *)0x0;
                do {
                  puVar3 = end_local + 1;
                  end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*end_local);
                  _block_size_2 = _block_size_2 - 1;
                  end_local = puVar3;
                } while (_block_size_2 != 0);
                if (puVar4 + -(long)puVar3 < end_3) {
                  return 0x32;
                }
                end_00 = puVar3 + (long)end_3;
                end_local = end_00;
                if (_capacity._6_2_ == 0x2e) {
                  end_local = puVar3;
                  iVar2 = decode32((uint32_t *)src_local,&end_local,end_00);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                  _capacity._0_4_ = 0;
                }
              } while (end_local == end_00);
              _capacity._0_4_ = 0x32;
            }
          }
        }
      }
    }
  }
  return (int)_capacity;
}

Assistant:

static int decode_new_session_ticket(uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *ticket, uint32_t *max_early_data_size,
                                     const uint8_t *src, const uint8_t *end)
{
    uint16_t exttype;
    int ret;

    if ((ret = decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = decode32(age_add, &src, end)) != 0)
        goto Exit;
    decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, &exttype, {
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_TICKET_EARLY_DATA_INFO:
            if ((ret = decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}